

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

_Bool sysbvm_astNode_isMacroExpression(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  ulong uVar1;
  _Bool _Var2;
  byte bVar3;
  ulong *puVar4;
  uint uVar5;
  
  _Var2 = sysbvm_tuple_isKindOf(context,tuple,(context->roots).astLiteralNodeType);
  if (!_Var2) {
    return false;
  }
  if ((tuple & 0xf) == 0 && tuple != 0) {
    puVar4 = *(ulong **)(tuple + 0x28);
  }
  else {
    puVar4 = (ulong *)0x0;
  }
  if (((ulong)puVar4 & 0xf) == 0 && puVar4 != (ulong *)0x0) {
    uVar1 = *puVar4;
    if (((uVar1 & 0xf) == 0 && uVar1 != 0) && ((*(byte *)(uVar1 + 8) & 0x80) == 0)) {
      uVar1 = *(ulong *)(uVar1 + 0x70);
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        uVar5 = (uint)((long)uVar1 >> 4);
      }
      else {
        uVar5 = (uint)*(undefined8 *)(uVar1 + 0x10);
      }
    }
    else {
      uVar5 = 0;
    }
    if ((uVar5 >> 0xc & 1) != 0) {
      uVar1 = puVar4[5];
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        bVar3 = (byte)((long)uVar1 >> 4);
      }
      else {
        bVar3 = (byte)*(undefined8 *)(uVar1 + 0x10);
      }
      goto LAB_0010c2c4;
    }
  }
  bVar3 = 0;
LAB_0010c2c4:
  return (_Bool)(bVar3 & 1);
}

Assistant:

SYSBVM_API bool sysbvm_astNode_isMacroExpression(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    if(sysbvm_astNode_isLiteralNode(context, tuple))
        return sysbvm_function_isMacro(context, sysbvm_astLiteralNode_getValue(tuple));

    return false;
}